

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::with_issuer(verifier<jwt::default_clock> *this,string *iss)

{
  pointer pcVar1;
  _storage _Var2;
  value *this_00;
  _Base_ptr *pp_Var3;
  ulong uVar4;
  value local_70;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  _Base_ptr p_Stack_48;
  key_type local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"iss","");
  pcVar1 = (iss->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + iss->_M_string_length);
  local_70.type_ = 3;
  local_70.u_.number_ = 0.0;
  local_70.u_.string_ = (string *)operator_new(0x20);
  pp_Var3 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                *)&(local_70.u_.array_)->
                   super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
             super__Rb_tree_header)._M_header._M_parent;
  *(_Base_ptr **)
   &(local_70.u_.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_> =
       pp_Var3;
  if (local_60 == &local_50) {
    *pp_Var3 = (_Base_ptr)CONCAT71(uStack_4f,local_50);
    *(_Base_ptr *)((long)&(local_70.u_.string_)->field_2 + 8) = p_Stack_48;
  }
  else {
    *(undefined1 **)
     &(local_70.u_.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_> =
         local_60;
    (((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       *)&(local_70.u_.array_)->
          super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
    super__Rb_tree_header)._M_header._M_parent = (_Base_ptr)CONCAT71(uStack_4f,local_50);
  }
  *(undefined8 *)&((_Rb_tree_header *)&(local_70.u_.string_)->_M_string_length)->_M_header =
       local_58;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  this_00 = &std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_40)->val;
  picojson::value::operator=(this_00,&local_70);
  _Var2 = local_70.u_;
  if (local_70.type_ == 5) {
    if (local_70.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) goto LAB_001054ab;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)local_70.u_.string_);
    uVar4 = 0x30;
  }
  else if (local_70.type_ == 4) {
    if (local_70.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) goto LAB_001054ab;
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_70.u_.string_);
    uVar4 = 0x18;
  }
  else {
    if ((local_70.type_ != 3) ||
       (local_70.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0)) goto LAB_001054ab;
    pp_Var3 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  *)&(local_70.u_.array_)->
                     super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
               super__Rb_tree_header)._M_header._M_parent;
    if ((_Base_ptr *)
        *(undefined1 **)
         &(local_70.u_.array_)->
          super__Vector_base<picojson::value,_std::allocator<picojson::value>_> != pp_Var3) {
      operator_delete(*(undefined1 **)
                       &(local_70.u_.array_)->
                        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>,
                      (ulong)((long)&(*pp_Var3)->_M_color + 1));
    }
    uVar4 = 0x20;
  }
  operator_delete(_Var2.string_,uVar4);
LAB_001054ab:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

verifier& with_issuer(const std::string& iss) { return with_claim("iss", claim(iss)); }